

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_get_nbits(void)

{
  mp_int *x_00;
  mp_int *pmVar1;
  mp_int *x;
  size_t i;
  mp_int *prev;
  mp_int *z;
  
  x_00 = mp_new(0x200);
  i = (size_t)mp_from_integer(0);
  x = (mp_int *)0x0;
  while( true ) {
    pmVar1 = (mp_int *)(*looplimit)(10);
    if (pmVar1 <= x) break;
    pmVar1 = mp_power_2(test_mp_get_nbits::bitposns[(long)x]);
    mp_add_into(x_00,pmVar1,(mp_int *)i);
    mp_free((mp_int *)i);
    log_start();
    mp_get_nbits(x_00);
    log_end();
    x = (mp_int *)((long)&x->nw + 1);
    i = (size_t)pmVar1;
  }
  mp_free((mp_int *)i);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_get_nbits(void)
{
    mp_int *z = mp_new(512);
    static const size_t bitposns[] = {
        0, 1, 5, 16, 23, 32, 67, 123, 234, 511
    };
    mp_int *prev = mp_from_integer(0);
    for (size_t i = 0; i < looplimit(lenof(bitposns)); i++) {
        mp_int *x = mp_power_2(bitposns[i]);
        mp_add_into(z, x, prev);
        mp_free(prev);
        prev = x;
        log_start();
        mp_get_nbits(z);
        log_end();
    }
    mp_free(prev);
    mp_free(z);
}